

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O1

bool __thiscall QDtls::abortHandshake(QDtls *this,QUdpSocket *socket)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)(*(long *)&this->field_0x8 + 0x78);
  if (plVar1 != (long *)0x0) {
    if (socket != (QUdpSocket *)0x0) {
      iVar4 = (**(code **)(*plVar1 + 0x90))(plVar1);
      if (iVar4 != 2) {
        iVar4 = (**(code **)(*plVar1 + 0x90))(plVar1);
        if (iVar4 != 1) {
          lVar2 = *(long *)(*plVar1 + -0x60);
          QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x285269);
          lVar5 = *(long *)((long)plVar1 + lVar2);
          uVar6 = 2;
          goto LAB_0025b1bf;
        }
      }
      (**(code **)(*plVar1 + 0xc0))(plVar1,socket);
      bVar3 = true;
      goto LAB_0025b1e8;
    }
    lVar2 = *(long *)(*plVar1 + -0x60);
    QMetaObject::tr((char *)local_40,(char *)&staticMetaObject,0x2850e2);
    lVar5 = *(long *)((long)plVar1 + lVar2);
    uVar6 = 1;
LAB_0025b1bf:
    (**(code **)(lVar5 + 0x10))((long)plVar1 + lVar2,uVar6,local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
  }
  bVar3 = false;
LAB_0025b1e8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::abortHandshake(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters, tr("Invalid (nullptr) socket"));
        return false;
    }

    if (backend->state() != PeerVerificationFailed && backend->state() != HandshakeInProgress) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("No handshake in progress, nothing to abort"));
        return false;
    }

    backend->abortHandshake(socket);
    return true;
}